

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qwidget.cpp
# Opt level: O1

void QWidget::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  short sVar1;
  short sVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  undefined8 *puVar6;
  long *plVar7;
  QRect *this;
  char16_t *pcVar8;
  QWidgetData *pQVar9;
  anon_union_4_2_313b0b05_for_QSizePolicy_1 *r;
  QWidgetPrivate *pQVar10;
  qreal qVar11;
  bool bVar12;
  byte bVar13;
  uint uVar14;
  QWindow *pQVar15;
  int *piVar16;
  QSize QVar17;
  QPalette *pQVar18;
  ulong uVar19;
  int iVar20;
  undefined8 uVar21;
  ulong uVar22;
  undefined1 on;
  undefined8 uVar23;
  InputMethodQuery query;
  WidgetAttribute attribute;
  QLocale QVar24;
  long lVar25;
  long in_FS_OFFSET;
  QRect QVar26;
  QIcon moved;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  QWidgetData *local_48;
  QWidgetData *local_38;
  
  local_38 = *(QWidgetData **)(in_FS_OFFSET + 0x28);
  switch(_c);
  switch(_id) {
  case 0:
    local_58._8_8_ = _a[1];
    iVar20 = 0;
    goto LAB_00312438;
  case 1:
    local_58._8_8_ = _a[1];
    iVar20 = 1;
    goto LAB_00312438;
  case 2:
    local_58._8_8_ = _a[1];
    iVar20 = 2;
    goto LAB_00312438;
  case 3:
    local_58._8_8_ = _a[1];
    iVar20 = 3;
LAB_00312438:
    local_58._0_8_ = (QLocale)0x0;
    QMetaObject::activate(_o,&staticMetaObject,iVar20,(void **)local_58);
    break;
  case 4:
    bVar13 = *_a[1];
    goto LAB_00312475;
  case 5:
    bVar13 = *_a[1] ^ 1;
LAB_00312475:
    setEnabled((QWidget *)_o,(bool)bVar13);
    break;
  case 6:
    setWindowModified((QWidget *)_o,*_a[1]);
    break;
  case 7:
    setWindowTitle((QWidget *)_o,(QString *)_a[1]);
    break;
  case 8:
    setStyleSheet((QWidget *)_o,(QString *)_a[1]);
    break;
  case 9:
    setFocus((QWidget *)_o,OtherFocusReason);
    break;
  case 10:
    update((QWidget *)_o);
    break;
  case 0xb:
    repaint((QWidget *)_o);
    break;
  case 0xc:
    bVar13 = *_a[1];
    lVar25 = *(long *)_o;
    goto LAB_0031249f;
  case 0xd:
    lVar25 = *(long *)_o;
    bVar13 = *_a[1] ^ 1;
    goto LAB_0031249f;
  case 0xe:
    show((QWidget *)_o);
    break;
  case 0xf:
    lVar25 = *(long *)_o;
    bVar13 = 0;
LAB_0031249f:
    (**(code **)(lVar25 + 0x68))(_o,bVar13);
    break;
  case 0x10:
    showMinimized((QWidget *)_o);
    break;
  case 0x11:
    showMaximized((QWidget *)_o);
    break;
  case 0x12:
    showFullScreen((QWidget *)_o);
    break;
  case 0x13:
    showNormal((QWidget *)_o);
    break;
  case 0x14:
    iVar20 = QWidgetPrivate::close(*(QWidgetPrivate **)(_o + 8),_c);
    if ((undefined1 *)*_a != (undefined1 *)0x0) {
      *(char *)*_a = (char)iVar20;
    }
    break;
  case 0x15:
    raise((QWidget *)_o,_c);
    break;
  case 0x16:
    lower((QWidget *)_o);
    break;
  case 0x17:
    query = *_a[1];
    goto LAB_00312506;
  case 0x18:
    query = ImQueryAll;
LAB_00312506:
    updateMicroFocus((QWidget *)_o,query);
    break;
  case 0x19:
    QWidgetPrivate::_q_showIfNotHidden(*(QWidgetPrivate **)(_o + 8));
    break;
  case 0x1a:
    puVar6 = (undefined8 *)*_a;
    if (puVar6 != (undefined8 *)0x0) {
      pQVar15 = QWidgetPrivate::windowHandle(*(QWidgetPrivate **)(_o + 8),Closest);
      *puVar6 = pQVar15;
    }
    break;
  case 0x1b:
    goto LAB_00312537;
  case 0x1c:
    local_68._0_8_ = (QIconPrivate *)0x0;
    local_68._8_8_ = 0xfffffffefffffffe;
LAB_00312537:
    local_48 = (QWidgetData *)&DAT_aaaaaaaaaaaaaaaa;
    local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    grab((QWidget *)local_58,(QRect *)_o);
    if ((QPixmap *)*_a != (QPixmap *)0x0) {
      QPixmap::operator=((QPixmap *)*_a,(QPixmap *)local_58);
    }
    QPixmap::~QPixmap((QPixmap *)local_58);
  }
  if (_c != ReadProperty) {
    if (_c == WriteProperty) goto switchD_003122aa_caseD_2;
    if (_c != IndexOfMethod) goto switchD_00312ced_caseD_4;
    plVar7 = (long *)_a[1];
    if (((code *)*plVar7 == windowTitleChanged) && (plVar7[1] == 0)) {
      *(undefined4 *)*_a = 0;
      goto switchD_003122aa_caseD_4;
    }
    if (((code *)*plVar7 == windowIconChanged) && (plVar7[1] == 0)) {
      *(undefined4 *)*_a = 1;
      goto switchD_003122aa_caseD_4;
    }
    if (((code *)*plVar7 == windowIconTextChanged) && (plVar7[1] == 0)) {
      *(undefined4 *)*_a = 2;
      goto switchD_003122aa_caseD_4;
    }
    if (((code *)*plVar7 == customContextMenuRequested) && (plVar7[1] == 0)) {
      *(undefined4 *)*_a = 3;
      goto switchD_003122aa_caseD_4;
    }
    if (_c != ResetProperty) {
      if (_c != WriteProperty) {
        if (_c != ReadProperty) goto switchD_003122aa_caseD_4;
        goto switchD_003122aa_caseD_1;
      }
      goto switchD_003122aa_caseD_2;
    }
    goto switchD_003122aa_caseD_3;
  }
switchD_003122aa_caseD_1:
  if (0x3b < (uint)_id) goto LAB_00312cbd;
  this = (QRect *)*_a;
  switch(_id) {
  case 0:
    *(bool *)&(this->x1).m_i = (*(uint *)(*(long *)(_o + 0x20) + 0x10) & 0x30000) != 0;
    break;
  case 1:
    uVar14 = *(ushort *)(*(long *)(_o + 0x20) + 0x12) & 3;
    goto LAB_00312cb9;
  case 2:
    bVar13 = ~*(byte *)(*(long *)(_o + 0x20) + 8);
    goto LAB_00312be4;
  case 3:
    uVar21 = *(undefined8 *)(*(long *)(_o + 0x20) + 0x14);
    uVar23 = *(undefined8 *)(*(long *)(_o + 0x20) + 0x1c);
    this->x1 = (Representation)(int)uVar21;
    this->y1 = (Representation)(int)((ulong)uVar21 >> 0x20);
    this->x2 = (Representation)(int)uVar23;
    this->y2 = (Representation)(int)((ulong)uVar23 >> 0x20);
    break;
  case 4:
    QVar26 = frameGeometry((QWidget *)_o);
    goto LAB_003129b3;
  case 5:
    QVar26 = normalGeometry((QWidget *)_o);
    goto LAB_003129b3;
  case 6:
    uVar14 = x((QWidget *)_o);
    goto LAB_00312cb9;
  case 7:
    uVar14 = y((QWidget *)_o);
    goto LAB_00312cb9;
  case 8:
    QVar17 = (QSize)pos((QWidget *)_o);
    goto LAB_00312bba;
  case 9:
    QVar17 = frameSize((QWidget *)_o);
    goto LAB_00312bba;
  case 10:
    lVar25 = *(long *)(_o + 0x20);
    iVar20 = *(int *)(lVar25 + 0x20);
    iVar3 = *(int *)(lVar25 + 0x18);
    this->x1 = (Representation)((*(int *)(lVar25 + 0x1c) - *(int *)(lVar25 + 0x14)) + 1);
    this->y1 = (Representation)((iVar20 - iVar3) + 1);
    break;
  case 0xb:
    iVar20 = *(int *)(*(long *)(_o + 0x20) + 0x1c) - *(int *)(*(long *)(_o + 0x20) + 0x14);
    goto LAB_00312887;
  case 0xc:
    iVar20 = *(int *)(*(long *)(_o + 0x20) + 0x20) - *(int *)(*(long *)(_o + 0x20) + 0x18);
LAB_00312887:
    (this->x1).m_i = iVar20 + 1;
    break;
  case 0xd:
    lVar25 = *(long *)(_o + 0x20);
    iVar20 = *(int *)(lVar25 + 0x1c);
    iVar3 = *(int *)(lVar25 + 0x20);
    iVar4 = *(int *)(lVar25 + 0x14);
    iVar5 = *(int *)(lVar25 + 0x18);
    this->x1 = 0;
    this->y1 = 0;
    this->x2 = (Representation)(iVar20 - iVar4);
    this->y2 = (Representation)(iVar3 - iVar5);
    break;
  case 0xe:
    QVar26 = childrenRect((QWidget *)_o);
LAB_003129b3:
    *this = QVar26;
    break;
  case 0xf:
    childrenRegion((QWidget *)local_58);
    this->x1 = (Representation)local_58._0_4_;
    this->y1 = (Representation)local_58._4_4_;
    local_58._0_8_ = *(QLocale *)this;
    QRegion::~QRegion((QRegion *)local_58);
    break;
  case 0x10:
    uVar14 = *(uint *)(*(long *)(_o + 8) + 0x208);
    goto LAB_00312cb9;
  case 0x11:
    if (*(long *)(*(long *)(_o + 8) + 0x78) == 0) {
      QVar17.wd.m_i = 0;
      QVar17.ht.m_i = 0;
    }
    else {
      QVar17 = *(QSize *)(*(long *)(*(long *)(_o + 8) + 0x78) + 0x60);
    }
    goto LAB_00312bba;
  case 0x12:
    if (*(long *)(*(long *)(_o + 8) + 0x78) == 0) {
      QVar17.wd.m_i = 0xffffff;
      QVar17.ht.m_i = 0xffffff;
    }
    else {
      QVar17 = *(QSize *)(*(long *)(*(long *)(_o + 8) + 0x78) + 0x68);
    }
    goto LAB_00312bba;
  case 0x13:
    if (*(long *)(*(long *)(_o + 8) + 0x78) == 0) {
LAB_00312cb7:
      uVar14 = 0;
    }
    else {
      uVar14 = *(uint *)(*(long *)(*(long *)(_o + 8) + 0x78) + 0x60);
    }
    goto LAB_00312cb9;
  case 0x14:
    if (*(long *)(*(long *)(_o + 8) + 0x78) == 0) goto LAB_00312cb7;
    uVar14 = *(uint *)(*(long *)(*(long *)(_o + 8) + 0x78) + 100);
    goto LAB_00312cb9;
  case 0x15:
    if (*(long *)(*(long *)(_o + 8) + 0x78) == 0) {
LAB_00312cb0:
      uVar14 = 0xffffff;
    }
    else {
      uVar14 = *(uint *)(*(long *)(*(long *)(_o + 8) + 0x78) + 0x68);
    }
    goto LAB_00312cb9;
  case 0x16:
    if (*(long *)(*(long *)(_o + 8) + 0x78) == 0) goto LAB_00312cb0;
    uVar14 = *(uint *)(*(long *)(*(long *)(_o + 8) + 0x78) + 0x6c);
    goto LAB_00312cb9;
  case 0x17:
    if ((*(long *)(*(long *)(_o + 8) + 0x78) != 0) &&
       (lVar25 = *(long *)(*(long *)(*(long *)(_o + 8) + 0x78) + 8), lVar25 != 0)) {
      sVar1 = *(short *)(lVar25 + 0x88);
      sVar2 = *(short *)(lVar25 + 0x8a);
      goto LAB_00312bab;
    }
LAB_00312bb3:
    uVar19 = 0;
    uVar22 = 0;
    goto LAB_00312bb7;
  case 0x18:
    if ((*(long *)(*(long *)(_o + 8) + 0x78) == 0) ||
       (lVar25 = *(long *)(*(long *)(*(long *)(_o + 8) + 0x78) + 8), lVar25 == 0))
    goto LAB_00312bb3;
    sVar1 = *(short *)(lVar25 + 0x8c);
    sVar2 = *(short *)(lVar25 + 0x8e);
LAB_00312bab:
    uVar19 = (long)sVar2 << 0x20;
    uVar22 = (ulong)(uint)(int)sVar1;
LAB_00312bb7:
    QVar17 = (QSize)(uVar19 | uVar22);
    goto LAB_00312bba;
  case 0x19:
    pQVar18 = palette((QWidget *)_o);
    QPalette::operator=((QPalette *)this,pQVar18);
    break;
  case 0x1a:
    QFont::operator=((QFont *)this,(QFont *)(*(long *)(_o + 0x20) + 0x38));
    break;
  case 0x1b:
    cursor((QWidget *)local_68);
    uVar21 = local_68._0_8_;
    local_68._0_8_ = (QIconPrivate *)0x0;
    uVar23 = local_68._0_8_;
    local_58._0_8_ = *(undefined8 *)this;
    local_68._0_4_ = (undefined4)uVar21;
    local_68._4_4_ = SUB84(uVar21,4);
    this->x1 = (Representation)local_68._0_4_;
    this->y1 = (Representation)local_68._4_4_;
    local_68._0_8_ = uVar23;
    QCursor::~QCursor((QCursor *)local_58);
    QCursor::~QCursor((QCursor *)local_68);
    break;
  case 0x1c:
    bVar13 = *(byte *)(*(long *)(_o + 0x20) + 8);
    goto LAB_00312be1;
  case 0x1d:
    bVar13 = *(byte *)(*(long *)(_o + 8) + 0x24c);
    goto LAB_00312bd6;
  case 0x1e:
    bVar12 = isActiveWindow((QWidget *)_o);
    goto LAB_00312be6;
  case 0x1f:
    uVar14 = *(uint *)(*(long *)(_o + 0x20) + 0x10) >> 4 & 0xf;
    goto LAB_00312cb9;
  case 0x20:
    bVar12 = hasFocus((QWidget *)_o);
    goto LAB_00312be6;
  case 0x21:
    uVar14 = *(uint *)(*(long *)(_o + 0x20) + 0x10) >> 0xd & 7;
    goto LAB_00312cb9;
  case 0x22:
    *(bool *)&(this->x1).m_i = (*(uint *)(*(long *)(_o + 0x20) + 8) >> 10 & 1) == 0;
    break;
  case 0x23:
    bVar13 = (byte)(*(uint *)(*(long *)(_o + 0x20) + 8) >> 0xf);
    goto LAB_00312c5a;
  case 0x24:
    bVar13 = *(byte *)(*(long *)(_o + 0x20) + 0x10);
    goto LAB_00312be4;
  case 0x25:
    bVar13 = *(byte *)(*(long *)(_o + 0x20) + 0x10);
LAB_00312bd6:
    bVar13 = bVar13 >> 1;
    goto LAB_00312be4;
  case 0x26:
    bVar13 = *(byte *)(*(long *)(_o + 0x20) + 0x10);
LAB_00312be1:
    bVar13 = bVar13 >> 2;
LAB_00312be4:
    bVar12 = (bool)(bVar13 & 1);
LAB_00312be6:
    *(bool *)&(this->x1).m_i = bVar12;
    break;
  case 0x27:
    QVar17 = (QSize)(**(code **)(*(long *)_o + 0x70))(_o);
    goto LAB_00312bba;
  case 0x28:
    QVar17 = (QSize)(**(code **)(*(long *)_o + 0x78))(_o);
LAB_00312bba:
    this->x1 = (Representation)QVar17.wd.m_i;
    this->y1 = (Representation)QVar17.ht.m_i;
    break;
  case 0x29:
    bVar13 = (byte)(*(uint *)(*(long *)(_o + 8) + 0x244) >> 0xe);
    goto LAB_00312c5a;
  case 0x2a:
    windowTitle((QString *)local_58,(QWidget *)_o);
    QVar24 = *(QLocale *)this;
    this->x1 = (Representation)local_58._0_4_;
    this->y1 = (Representation)local_58._4_4_;
    pcVar8 = *(char16_t **)&this->x2;
    this->x2 = (Representation)local_58._8_4_;
    this->y2 = (Representation)local_58._12_4_;
    pQVar9 = *(QWidgetData **)(this + 1);
    *(QWidgetData **)(this + 1) = local_48;
    local_58._0_8_ = QVar24;
    local_58._8_8_ = pcVar8;
    local_48 = pQVar9;
    if (QVar24 == (QLocale)0x0) break;
    LOCK();
    *(int *)QVar24 = *(int *)QVar24 + -1;
    UNLOCK();
    if (*(int *)QVar24 != 0) break;
    goto LAB_00312c9f;
  case 0x2b:
    windowIcon((QWidget *)local_68);
    uVar21 = local_68._0_8_;
    local_68._0_8_ = (QIconPrivate *)0x0;
    uVar23 = local_68._0_8_;
    local_58._0_8_ = *(undefined8 *)this;
    local_68._0_4_ = (undefined4)uVar21;
    local_68._4_4_ = SUB84(uVar21,4);
    this->x1 = (Representation)local_68._0_4_;
    this->y1 = (Representation)local_68._4_4_;
    local_68._0_8_ = uVar23;
    QIcon::~QIcon((QIcon *)local_58);
    QIcon::~QIcon((QIcon *)local_68);
    break;
  case 0x2c:
    if ((*(long *)(*(long *)(_o + 8) + 0x78) != 0) &&
       (lVar25 = *(long *)(*(long *)(*(long *)(_o + 8) + 0x78) + 8), lVar25 != 0)) {
      piVar16 = *(int **)(lVar25 + 0x40);
      uVar21 = *(undefined8 *)(lVar25 + 0x48);
      uVar23 = *(undefined8 *)(lVar25 + 0x50);
      goto LAB_00312c7b;
    }
LAB_0031282d:
    piVar16 = (int *)0x0;
    uVar21 = 0;
    uVar23 = 0;
    goto LAB_00312c83;
  case 0x2d:
    qVar11 = windowOpacity((QWidget *)_o);
    *(qreal *)this = qVar11;
    break;
  case 0x2e:
    bVar13 = (byte)(*(uint *)(*(long *)(_o + 8) + 0x240) >> 9);
LAB_00312c5a:
    bVar13 = bVar13 & 1;
LAB_00312c5c:
    *(byte *)&(this->x1).m_i = bVar13;
    break;
  case 0x2f:
    lVar25 = *(long *)(_o + 8);
    piVar16 = *(int **)(lVar25 + 0xe8);
    uVar21 = *(undefined8 *)(lVar25 + 0xf0);
    uVar23 = *(undefined8 *)(lVar25 + 0xf8);
    goto LAB_00312c7b;
  case 0x30:
    uVar14 = *(uint *)(*(long *)(_o + 8) + 0x100);
    goto LAB_00312cb9;
  case 0x31:
    lVar25 = *(long *)(_o + 8);
    piVar16 = *(int **)(lVar25 + 0x108);
    uVar21 = *(undefined8 *)(lVar25 + 0x110);
    uVar23 = *(undefined8 *)(lVar25 + 0x118);
    goto LAB_00312c7b;
  case 0x32:
    lVar25 = *(long *)(_o + 8);
    piVar16 = *(int **)(lVar25 + 0x120);
    uVar21 = *(undefined8 *)(lVar25 + 0x128);
    uVar23 = *(undefined8 *)(lVar25 + 0x130);
    goto LAB_00312c7b;
  case 0x33:
    lVar25 = *(long *)(_o + 8);
    piVar16 = *(int **)(lVar25 + 0x138);
    uVar21 = *(undefined8 *)(lVar25 + 0x140);
    uVar23 = *(undefined8 *)(lVar25 + 0x148);
    goto LAB_00312c7b;
  case 0x34:
    lVar25 = *(long *)(_o + 8);
    piVar16 = *(int **)(lVar25 + 0x150);
    uVar21 = *(undefined8 *)(lVar25 + 0x158);
    uVar23 = *(undefined8 *)(lVar25 + 0x160);
    goto LAB_00312c7b;
  case 0x35:
    lVar25 = *(long *)(_o + 8);
    piVar16 = *(int **)(lVar25 + 0x168);
    uVar21 = *(undefined8 *)(lVar25 + 0x170);
    uVar23 = *(undefined8 *)(lVar25 + 0x178);
    goto LAB_00312c7b;
  case 0x36:
    uVar14 = *(uint *)(*(long *)(_o + 8) + 0x240) >> 0x18 & 1;
    goto LAB_00312cb9;
  case 0x37:
    if (*(long *)(*(long *)(_o + 8) + 0x78) != 0) {
      bVar13 = *(byte *)(*(long *)(*(long *)(_o + 8) + 0x78) + 0x7c) >> 4;
      goto LAB_00312c5a;
    }
    bVar13 = 0;
    goto LAB_00312c5c;
  case 0x38:
    lVar25 = *(long *)(*(long *)(_o + 8) + 0x78);
    if (lVar25 == 0) goto LAB_0031282d;
    piVar16 = *(int **)(lVar25 + 0x48);
    uVar21 = *(undefined8 *)(lVar25 + 0x50);
    uVar23 = *(undefined8 *)(lVar25 + 0x58);
    goto LAB_00312c7b;
  case 0x39:
    QLocale::QLocale((QLocale *)local_58,(QLocale *)(*(long *)(_o + 8) + 0x210));
    this->x1 = (Representation)local_58._0_4_;
    this->y1 = (Representation)local_58._4_4_;
    local_58._0_8_ = *(QLocale *)this;
    QLocale::~QLocale((QLocale *)local_58);
    break;
  case 0x3a:
    if ((*(long *)(*(long *)(_o + 8) + 0x78) == 0) ||
       (lVar25 = *(long *)(*(long *)(*(long *)(_o + 8) + 0x78) + 8), lVar25 == 0))
    goto LAB_0031282d;
    piVar16 = *(int **)(lVar25 + 0x70);
    uVar21 = *(undefined8 *)(lVar25 + 0x78);
    uVar23 = *(undefined8 *)(lVar25 + 0x80);
LAB_00312c7b:
    if (piVar16 != (int *)0x0) {
      LOCK();
      *piVar16 = *piVar16 + 1;
      UNLOCK();
    }
LAB_00312c83:
    QVar24 = *(QLocale *)this;
    *(int **)this = piVar16;
    this->x2 = (Representation)(int)uVar21;
    this->y2 = (Representation)(int)((ulong)uVar21 >> 0x20);
    this[1].x1 = (Representation)(int)uVar23;
    this[1].y1 = (Representation)(int)((ulong)uVar23 >> 0x20);
    if (QVar24 != (QLocale)0x0) {
      LOCK();
      *(int *)QVar24 = *(int *)QVar24 + -1;
      UNLOCK();
      if (*(int *)QVar24 == 0) {
LAB_00312c9f:
        QArrayData::deallocate((QArrayData *)QVar24,2,0x10);
      }
    }
    break;
  case 0x3b:
    for (lVar25 = *(long *)(_o + 8); (*(byte *)(lVar25 + 0x253) & 4) != 0;
        lVar25 = *(long *)(*(long *)(*(long *)(*(long *)(lVar25 + 8) + 8) + 0x10) + 8)) {
    }
    uVar14 = *(uint *)(lVar25 + 0xd0);
LAB_00312cb9:
    (this->x1).m_i = uVar14;
  }
LAB_00312cbd:
  if (_c == ResetProperty) goto switchD_003122aa_caseD_3;
  if (_c != WriteProperty) goto switchD_003122aa_caseD_4;
switchD_003122aa_caseD_2:
  if (0x3a < _id - 1U) goto switchD_00312ced_caseD_4;
  r = (anon_union_4_2_313b0b05_for_QSizePolicy_1 *)*_a;
  switch(_id) {
  case 1:
    setWindowModality((QWidget *)_o,r->data);
    break;
  case 2:
    setEnabled((QWidget *)_o,*(bool *)r);
    break;
  case 3:
    setGeometry((QWidget *)_o,(QRect *)&r->bits);
    break;
  case 8:
    move((QWidget *)_o,(QPoint *)&r->bits);
    break;
  case 10:
    resize((QWidget *)_o,(QSize *)&r->bits);
    break;
  case 0x10:
    setSizePolicy((QWidget *)_o,(QSizePolicy)*(anon_union_4_2_313b0b05_for_QSizePolicy_1 *)&r->bits)
    ;
    break;
  case 0x11:
    setMinimumSize((QWidget *)_o,r->data,r[1].data);
    break;
  case 0x12:
    setMaximumSize((QWidget *)_o,r->data,r[1].data);
    break;
  case 0x13:
    setMinimumWidth((QWidget *)_o,r->data);
    break;
  case 0x14:
    setMinimumHeight((QWidget *)_o,r->data);
    break;
  case 0x15:
    setMaximumWidth((QWidget *)_o,r->data);
    break;
  case 0x16:
    setMaximumHeight((QWidget *)_o,r->data);
    break;
  case 0x17:
    setSizeIncrement((QWidget *)_o,r->data,r[1].data);
    break;
  case 0x18:
    setBaseSize((QWidget *)_o,r->data,r[1].data);
    break;
  case 0x19:
    setPalette((QWidget *)_o,(QPalette *)&r->bits);
    break;
  case 0x1a:
    setFont((QWidget *)_o,(QFont *)&r->bits);
    break;
  case 0x1b:
    setCursor((QWidget *)_o,(QCursor *)&r->bits);
    break;
  case 0x1c:
    on = *(undefined1 *)r;
    attribute = WA_MouseTracking;
    goto LAB_00312ef1;
  case 0x1d:
    on = *(undefined1 *)r;
    attribute = WA_TabletTracking;
    goto LAB_00312ef1;
  case 0x1f:
    setFocusPolicy((QWidget *)_o,r->data);
    break;
  case 0x21:
    *(uint *)(*(long *)(_o + 0x20) + 0x10) =
         *(uint *)(*(long *)(_o + 0x20) + 0x10) & 0xffff1fff | (r->data & 7) << 0xd;
    break;
  case 0x22:
    setUpdatesEnabled((QWidget *)_o,*(bool *)r);
    break;
  case 0x23:
    (**(code **)(*(long *)_o + 0x68))(_o,*(undefined1 *)r);
    break;
  case 0x29:
    on = *(undefined1 *)r;
    attribute = WA_AcceptDrops;
LAB_00312ef1:
    setAttribute((QWidget *)_o,attribute,(bool)on);
    break;
  case 0x2a:
    setWindowTitle((QWidget *)_o,(QString *)&r->bits);
    break;
  case 0x2b:
    setWindowIcon((QWidget *)_o,(QIcon *)&r->bits);
    break;
  case 0x2c:
    setWindowIconText((QWidget *)_o,(QString *)&r->bits);
    break;
  case 0x2d:
    setWindowOpacity((QWidget *)_o,*(qreal *)r);
    break;
  case 0x2e:
    setWindowModified((QWidget *)_o,*(bool *)r);
    break;
  case 0x2f:
    setToolTip((QWidget *)_o,(QString *)&r->bits);
    break;
  case 0x30:
    ((anon_union_4_2_313b0b05_for_QSizePolicy_1 *)(*(long *)(_o + 8) + 0x100))->bits = *(Bits *)r;
    break;
  case 0x31:
    lVar25 = 0x108;
    goto LAB_00312f6b;
  case 0x32:
    lVar25 = 0x120;
LAB_00312f6b:
    QString::operator=((QString *)(lVar25 + *(long *)(_o + 8)),(QString *)r);
    break;
  case 0x33:
    setAccessibleName((QWidget *)_o,(QString *)&r->bits);
    break;
  case 0x34:
    setAccessibleDescription((QWidget *)_o,(QString *)&r->bits);
    break;
  case 0x35:
    setAccessibleIdentifier((QWidget *)_o,(QString *)&r->bits);
    break;
  case 0x36:
    setLayoutDirection((QWidget *)_o,r->data);
    break;
  case 0x37:
    setAutoFillBackground((QWidget *)_o,*(bool *)r);
    break;
  case 0x38:
    setStyleSheet((QWidget *)_o,(QString *)&r->bits);
    break;
  case 0x39:
    pQVar10 = *(QWidgetPrivate **)(_o + 8);
    if ((pQVar10->high_attributes[1] >> 0x17 & 1) == 0) {
      pQVar10->high_attributes[1] = pQVar10->high_attributes[1] | 0x800000;
    }
    QWidgetPrivate::setLocale_helper(pQVar10,(QLocale *)&r->bits,false);
    break;
  case 0x3a:
    setWindowFilePath((QWidget *)_o,(QString *)&r->bits);
    break;
  case 0x3b:
    setInputMethodHints((QWidget *)_o,
                        (QFlagsStorageHelper<Qt::InputMethodHint,_4>)
                        *(QFlagsStorageHelper<Qt::InputMethodHint,_4> *)&r->bits);
  }
switchD_00312ced_caseD_4:
  if (_c == ResetProperty) {
switchD_003122aa_caseD_3:
    if (_id == 0x39) {
      pQVar10 = *(QWidgetPrivate **)(_o + 8);
      if ((pQVar10->high_attributes[1] >> 0x17 & 1) != 0) {
        pQVar10->high_attributes[1] = pQVar10->high_attributes[1] & 0xff7fffff;
      }
      QWidgetPrivate::resolveLocale(pQVar10);
    }
    else if (_id == 0x36) {
      pQVar10 = *(QWidgetPrivate **)(_o + 8);
      if ((pQVar10->high_attributes[0] >> 0x19 & 1) != 0) {
        pQVar10->high_attributes[0] = pQVar10->high_attributes[0] & 0xfdffffff;
      }
      QWidgetPrivate::resolveLayoutDirection(pQVar10);
    }
    else if (_id == 0x1b) {
      unsetCursor((QWidget *)_o);
    }
  }
switchD_003122aa_caseD_4:
  if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidget::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QWidget *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->windowTitleChanged((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 1: _t->windowIconChanged((*reinterpret_cast< std::add_pointer_t<QIcon>>(_a[1]))); break;
        case 2: _t->windowIconTextChanged((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 3: _t->customContextMenuRequested((*reinterpret_cast< std::add_pointer_t<QPoint>>(_a[1]))); break;
        case 4: _t->setEnabled((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 5: _t->setDisabled((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 6: _t->setWindowModified((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 7: _t->setWindowTitle((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 8: _t->setStyleSheet((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 9: _t->setFocus(); break;
        case 10: _t->update(); break;
        case 11: _t->repaint(); break;
        case 12: _t->setVisible((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 13: _t->setHidden((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 14: _t->show(); break;
        case 15: _t->hide(); break;
        case 16: _t->showMinimized(); break;
        case 17: _t->showMaximized(); break;
        case 18: _t->showFullScreen(); break;
        case 19: _t->showNormal(); break;
        case 20: { bool _r = _t->close();
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 21: _t->raise(); break;
        case 22: _t->lower(); break;
        case 23: _t->updateMicroFocus((*reinterpret_cast< std::add_pointer_t<Qt::InputMethodQuery>>(_a[1]))); break;
        case 24: _t->updateMicroFocus(); break;
        case 25: _t->d_func()->_q_showIfNotHidden(); break;
        case 26: { QWindow* _r = _t->d_func()->_q_closestWindowHandle();
            if (_a[0]) *reinterpret_cast< QWindow**>(_a[0]) = std::move(_r); }  break;
        case 27: { QPixmap _r = _t->grab((*reinterpret_cast< std::add_pointer_t<QRect>>(_a[1])));
            if (_a[0]) *reinterpret_cast< QPixmap*>(_a[0]) = std::move(_r); }  break;
        case 28: { QPixmap _r = _t->grab();
            if (_a[0]) *reinterpret_cast< QPixmap*>(_a[0]) = std::move(_r); }  break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QWidget::*)(const QString & )>(_a, &QWidget::windowTitleChanged, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QWidget::*)(const QIcon & )>(_a, &QWidget::windowIconChanged, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QWidget::*)(const QString & )>(_a, &QWidget::windowIconTextChanged, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QWidget::*)(const QPoint & )>(_a, &QWidget::customContextMenuRequested, 3))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<bool*>(_v) = _t->isModal(); break;
        case 1: *reinterpret_cast<Qt::WindowModality*>(_v) = _t->windowModality(); break;
        case 2: *reinterpret_cast<bool*>(_v) = _t->isEnabled(); break;
        case 3: *reinterpret_cast<QRect*>(_v) = _t->geometry(); break;
        case 4: *reinterpret_cast<QRect*>(_v) = _t->frameGeometry(); break;
        case 5: *reinterpret_cast<QRect*>(_v) = _t->normalGeometry(); break;
        case 6: *reinterpret_cast<int*>(_v) = _t->x(); break;
        case 7: *reinterpret_cast<int*>(_v) = _t->y(); break;
        case 8: *reinterpret_cast<QPoint*>(_v) = _t->pos(); break;
        case 9: *reinterpret_cast<QSize*>(_v) = _t->frameSize(); break;
        case 10: *reinterpret_cast<QSize*>(_v) = _t->size(); break;
        case 11: *reinterpret_cast<int*>(_v) = _t->width(); break;
        case 12: *reinterpret_cast<int*>(_v) = _t->height(); break;
        case 13: *reinterpret_cast<QRect*>(_v) = _t->rect(); break;
        case 14: *reinterpret_cast<QRect*>(_v) = _t->childrenRect(); break;
        case 15: *reinterpret_cast<QRegion*>(_v) = _t->childrenRegion(); break;
        case 16: *reinterpret_cast<QSizePolicy*>(_v) = _t->sizePolicy(); break;
        case 17: *reinterpret_cast<QSize*>(_v) = _t->minimumSize(); break;
        case 18: *reinterpret_cast<QSize*>(_v) = _t->maximumSize(); break;
        case 19: *reinterpret_cast<int*>(_v) = _t->minimumWidth(); break;
        case 20: *reinterpret_cast<int*>(_v) = _t->minimumHeight(); break;
        case 21: *reinterpret_cast<int*>(_v) = _t->maximumWidth(); break;
        case 22: *reinterpret_cast<int*>(_v) = _t->maximumHeight(); break;
        case 23: *reinterpret_cast<QSize*>(_v) = _t->sizeIncrement(); break;
        case 24: *reinterpret_cast<QSize*>(_v) = _t->baseSize(); break;
        case 25: *reinterpret_cast<QPalette*>(_v) = _t->palette(); break;
        case 26: *reinterpret_cast<QFont*>(_v) = _t->font(); break;
        case 27: *reinterpret_cast<QCursor*>(_v) = _t->cursor(); break;
        case 28: *reinterpret_cast<bool*>(_v) = _t->hasMouseTracking(); break;
        case 29: *reinterpret_cast<bool*>(_v) = _t->hasTabletTracking(); break;
        case 30: *reinterpret_cast<bool*>(_v) = _t->isActiveWindow(); break;
        case 31: *reinterpret_cast<Qt::FocusPolicy*>(_v) = _t->focusPolicy(); break;
        case 32: *reinterpret_cast<bool*>(_v) = _t->hasFocus(); break;
        case 33: *reinterpret_cast<Qt::ContextMenuPolicy*>(_v) = _t->contextMenuPolicy(); break;
        case 34: *reinterpret_cast<bool*>(_v) = _t->updatesEnabled(); break;
        case 35: *reinterpret_cast<bool*>(_v) = _t->isVisible(); break;
        case 36: *reinterpret_cast<bool*>(_v) = _t->isMinimized(); break;
        case 37: *reinterpret_cast<bool*>(_v) = _t->isMaximized(); break;
        case 38: *reinterpret_cast<bool*>(_v) = _t->isFullScreen(); break;
        case 39: *reinterpret_cast<QSize*>(_v) = _t->sizeHint(); break;
        case 40: *reinterpret_cast<QSize*>(_v) = _t->minimumSizeHint(); break;
        case 41: *reinterpret_cast<bool*>(_v) = _t->acceptDrops(); break;
        case 42: *reinterpret_cast<QString*>(_v) = _t->windowTitle(); break;
        case 43: *reinterpret_cast<QIcon*>(_v) = _t->windowIcon(); break;
        case 44: *reinterpret_cast<QString*>(_v) = _t->windowIconText(); break;
        case 45: *reinterpret_cast<double*>(_v) = _t->windowOpacity(); break;
        case 46: *reinterpret_cast<bool*>(_v) = _t->isWindowModified(); break;
        case 47: *reinterpret_cast<QString*>(_v) = _t->toolTip(); break;
        case 48: *reinterpret_cast<int*>(_v) = _t->toolTipDuration(); break;
        case 49: *reinterpret_cast<QString*>(_v) = _t->statusTip(); break;
        case 50: *reinterpret_cast<QString*>(_v) = _t->whatsThis(); break;
        case 51: *reinterpret_cast<QString*>(_v) = _t->accessibleName(); break;
        case 52: *reinterpret_cast<QString*>(_v) = _t->accessibleDescription(); break;
        case 53: *reinterpret_cast<QString*>(_v) = _t->accessibleIdentifier(); break;
        case 54: *reinterpret_cast<Qt::LayoutDirection*>(_v) = _t->layoutDirection(); break;
        case 55: *reinterpret_cast<bool*>(_v) = _t->autoFillBackground(); break;
        case 56: *reinterpret_cast<QString*>(_v) = _t->styleSheet(); break;
        case 57: *reinterpret_cast<QLocale*>(_v) = _t->locale(); break;
        case 58: *reinterpret_cast<QString*>(_v) = _t->windowFilePath(); break;
        case 59: *reinterpret_cast<Qt::InputMethodHints*>(_v) = _t->inputMethodHints(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 1: _t->setWindowModality(*reinterpret_cast<Qt::WindowModality*>(_v)); break;
        case 2: _t->setEnabled(*reinterpret_cast<bool*>(_v)); break;
        case 3: _t->setGeometry(*reinterpret_cast<QRect*>(_v)); break;
        case 8: _t->move(*reinterpret_cast<QPoint*>(_v)); break;
        case 10: _t->resize(*reinterpret_cast<QSize*>(_v)); break;
        case 16: _t->setSizePolicy(*reinterpret_cast<QSizePolicy*>(_v)); break;
        case 17: _t->setMinimumSize(*reinterpret_cast<QSize*>(_v)); break;
        case 18: _t->setMaximumSize(*reinterpret_cast<QSize*>(_v)); break;
        case 19: _t->setMinimumWidth(*reinterpret_cast<int*>(_v)); break;
        case 20: _t->setMinimumHeight(*reinterpret_cast<int*>(_v)); break;
        case 21: _t->setMaximumWidth(*reinterpret_cast<int*>(_v)); break;
        case 22: _t->setMaximumHeight(*reinterpret_cast<int*>(_v)); break;
        case 23: _t->setSizeIncrement(*reinterpret_cast<QSize*>(_v)); break;
        case 24: _t->setBaseSize(*reinterpret_cast<QSize*>(_v)); break;
        case 25: _t->setPalette(*reinterpret_cast<QPalette*>(_v)); break;
        case 26: _t->setFont(*reinterpret_cast<QFont*>(_v)); break;
        case 27: _t->setCursor(*reinterpret_cast<QCursor*>(_v)); break;
        case 28: _t->setMouseTracking(*reinterpret_cast<bool*>(_v)); break;
        case 29: _t->setTabletTracking(*reinterpret_cast<bool*>(_v)); break;
        case 31: _t->setFocusPolicy(*reinterpret_cast<Qt::FocusPolicy*>(_v)); break;
        case 33: _t->setContextMenuPolicy(*reinterpret_cast<Qt::ContextMenuPolicy*>(_v)); break;
        case 34: _t->setUpdatesEnabled(*reinterpret_cast<bool*>(_v)); break;
        case 35: _t->setVisible(*reinterpret_cast<bool*>(_v)); break;
        case 41: _t->setAcceptDrops(*reinterpret_cast<bool*>(_v)); break;
        case 42: _t->setWindowTitle(*reinterpret_cast<QString*>(_v)); break;
        case 43: _t->setWindowIcon(*reinterpret_cast<QIcon*>(_v)); break;
        case 44: _t->setWindowIconText(*reinterpret_cast<QString*>(_v)); break;
        case 45: _t->setWindowOpacity(*reinterpret_cast<double*>(_v)); break;
        case 46: _t->setWindowModified(*reinterpret_cast<bool*>(_v)); break;
        case 47: _t->setToolTip(*reinterpret_cast<QString*>(_v)); break;
        case 48: _t->setToolTipDuration(*reinterpret_cast<int*>(_v)); break;
        case 49: _t->setStatusTip(*reinterpret_cast<QString*>(_v)); break;
        case 50: _t->setWhatsThis(*reinterpret_cast<QString*>(_v)); break;
        case 51: _t->setAccessibleName(*reinterpret_cast<QString*>(_v)); break;
        case 52: _t->setAccessibleDescription(*reinterpret_cast<QString*>(_v)); break;
        case 53: _t->setAccessibleIdentifier(*reinterpret_cast<QString*>(_v)); break;
        case 54: _t->setLayoutDirection(*reinterpret_cast<Qt::LayoutDirection*>(_v)); break;
        case 55: _t->setAutoFillBackground(*reinterpret_cast<bool*>(_v)); break;
        case 56: _t->setStyleSheet(*reinterpret_cast<QString*>(_v)); break;
        case 57: _t->setLocale(*reinterpret_cast<QLocale*>(_v)); break;
        case 58: _t->setWindowFilePath(*reinterpret_cast<QString*>(_v)); break;
        case 59: _t->setInputMethodHints(*reinterpret_cast<Qt::InputMethodHints*>(_v)); break;
        default: break;
        }
    }
if (_c == QMetaObject::ResetProperty) {
        switch (_id) {
        case 27: _t->unsetCursor(); break;
        case 54: _t->unsetLayoutDirection(); break;
        case 57: _t->unsetLocale(); break;
        default: break;
        }
    }
}